

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O1

int Io_WriteMoPlaOneM(FILE *pFile,Abc_Ntk_t *pNtk,int nMints)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  int *piVar5;
  undefined8 *__ptr;
  DdNode *bFunc;
  int iVar6;
  DdManager *dd;
  uint *__ptr_00;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  undefined8 uVar9;
  DdNode *pDVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  char *__s;
  ulong uVar15;
  ulong uVar16;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    if (pNtk->ntkType != ABC_NTK_LOGIC) {
      return 1;
    }
    if (pNtk->ntkFunc != ABC_FUNC_BDD) {
      return 1;
    }
    if (0 < pNtk->vCos->nSize) {
      if (((DdManager *)pNtk->pManFunc)->size == pNtk->vCis->nSize) {
        plVar4 = (long *)*pNtk->vCos->pArray;
        Io_WriteMoPlaOneIntMintermsM
                  (pFile,pNtk,(DdManager *)pNtk->pManFunc,
                   *(DdNode **)
                    (*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                              (long)*(int *)plVar4[4] * 8) + 0x38),nMints);
        return 1;
      }
      puts("Cannot write minterms because the size of the manager for local BDDs is not equal to");
      puts("the number of primary inputs. (It is likely that the current network is not collapsed.)"
          );
      return 1;
    }
LAB_0034644e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
  if (dd == (DdManager *)0x0) {
    return 0;
  }
  uVar1 = pNtk->vCos->nSize;
  __ptr_00 = (uint *)malloc(0x10);
  uVar11 = 8;
  if (6 < uVar1 - 1) {
    uVar11 = uVar1;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar11;
  if (uVar11 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar11 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar7;
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      lVar13 = *(long *)(*pVVar8->pArray[lVar14] + 0x1b0);
      if (*(int *)(lVar13 + 4) < 8) goto LAB_0034644e;
      piVar5 = *(int **)(*(long *)(lVar13 + 8) + 0x38);
      if (*(void **)(piVar5 + 2) == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar2 = (int)*(long *)((long)pVVar8->pArray[lVar14] + 0x10);
      lVar13 = (long)iVar2;
      iVar3 = *piVar5;
      if (iVar3 <= iVar2) {
        iVar6 = iVar2 + 10;
        if (iVar2 < iVar3 * 2) {
          iVar6 = iVar3 * 2;
        }
        if (iVar3 < iVar6) {
          pvVar7 = realloc(*(void **)(piVar5 + 2),(long)iVar6 * 8);
          *(void **)(piVar5 + 2) = pvVar7;
          memset((void *)((long)pvVar7 + (long)*piVar5 * 8),0,((long)iVar6 - (long)*piVar5) * 8);
          *piVar5 = iVar6;
        }
      }
      if ((*(long *)(*(long *)(piVar5 + 2) + lVar13 * 8) == 0) &&
         (*(code **)(piVar5 + 8) != (code *)0x0)) {
        uVar9 = (**(code **)(piVar5 + 8))(*(undefined8 *)(piVar5 + 4));
        *(undefined8 *)(*(long *)(piVar5 + 2) + lVar13 * 8) = uVar9;
      }
      uVar9 = *(undefined8 *)(*(long *)(piVar5 + 2) + lVar13 * 8);
      uVar1 = __ptr_00[1];
      uVar11 = *__ptr_00;
      if (uVar1 == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          uVar12 = 0x10;
        }
        else {
          uVar12 = uVar11 * 2;
          if ((int)uVar12 <= (int)uVar11) goto LAB_0034634a;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc((ulong)uVar11 << 4);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar11 << 4);
          }
        }
        *(void **)(__ptr_00 + 2) = pvVar7;
        *__ptr_00 = uVar12;
      }
LAB_0034634a:
      __ptr_00[1] = uVar1 + 1;
      *(undefined8 *)(*(long *)(__ptr_00 + 2) + (long)(int)uVar1 * 8) = uVar9;
      lVar14 = lVar14 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar14 < pVVar8->nSize);
  }
  uVar1 = __ptr_00[1];
  if ((int)uVar1 < 1) goto LAB_0034644e;
  __ptr = *(undefined8 **)(__ptr_00 + 2);
  bFunc = (DdNode *)*__ptr;
  pDVar10 = Cudd_ReadOne(dd);
  if (bFunc == pDVar10) {
    __s = "First primary output has constant 1 function.";
  }
  else {
    pDVar10 = Cudd_ReadOne(dd);
    if (pDVar10 != (DdNode *)((ulong)bFunc ^ 1)) {
      Io_WriteMoPlaOneIntMintermsM(pFile,pNtk,dd,bFunc,nMints);
      goto LAB_003463e5;
    }
    __s = "First primary output has constant 0 function.";
  }
  puts(__s);
LAB_003463e5:
  uVar15 = 0;
  Abc_NtkFreeGlobalBdds(pNtk,0);
  uVar16 = 1;
  if (1 < (int)uVar1) {
    uVar16 = (ulong)uVar1;
  }
  do {
    Cudd_RecursiveDeref(dd,(DdNode *)__ptr[uVar15]);
    uVar15 = uVar15 + 1;
  } while (uVar16 != uVar15);
  free(__ptr);
  __ptr_00[2] = 0;
  __ptr_00[3] = 0;
  free(__ptr_00);
  Cudd_Quit(dd);
  return 1;
}

Assistant:

int Io_WriteMoPlaOneM( FILE * pFile, Abc_Ntk_t * pNtk, int nMints )
{
    int fVerbose = 0;
    DdManager * dd;
    DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int i;
    if ( Abc_NtkIsStrash(pNtk) )
    {
        assert( Abc_NtkIsStrash(pNtk) );
        dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
        if ( dd == NULL )
            return 0;
        if ( fVerbose )
            printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

        // complement the global functions
        vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

        // get the output function
        bFunc = (DdNode *)Vec_PtrEntry(vFuncsGlob, 0);
        if ( bFunc == Cudd_ReadOne(dd) )
            printf( "First primary output has constant 1 function.\n" );
        else if ( Cudd_Not(bFunc) == Cudd_ReadOne(dd) )
            printf( "First primary output has constant 0 function.\n" );
        else
            Io_WriteMoPlaOneIntMintermsM( pFile, pNtk, dd, bFunc, nMints );
        Abc_NtkFreeGlobalBdds( pNtk, 0 );

        // cleanup
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            Cudd_RecursiveDeref( dd, bFunc );
        Vec_PtrFree( vFuncsGlob );
        //Extra_StopManager( dd );
        Cudd_Quit( dd );
    }
    else if ( Abc_NtkIsBddLogic(pNtk) )
    {
        DdNode * bFunc = (DdNode *)Abc_ObjFanin0(Abc_NtkCo(pNtk, 0))->pData;
        dd = (DdManager *)pNtk->pManFunc;
        if ( dd->size == Abc_NtkCiNum(pNtk) )
            Io_WriteMoPlaOneIntMintermsM( pFile, pNtk, dd, bFunc, nMints );
        else
        {
            printf( "Cannot write minterms because the size of the manager for local BDDs is not equal to\n" );
            printf( "the number of primary inputs. (It is likely that the current network is not collapsed.)\n" );
        }
    }
    return 1;
}